

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpcommon_node.c
# Opt level: O0

void JPCommonNode_copy(JPCommonNode *node1,JPCommonNode *node2)

{
  JPCommonNode *in_RSI;
  JPCommonNode *in_RDI;
  char *in_stack_ffffffffffffffe8;
  
  JPCommonNode_set_pron(in_RSI,in_stack_ffffffffffffffe8);
  JPCommonNode_set_pos(in_RSI,in_stack_ffffffffffffffe8);
  JPCommonNode_set_ctype(in_RSI,in_stack_ffffffffffffffe8);
  JPCommonNode_set_cform(in_RSI,in_stack_ffffffffffffffe8);
  JPCommonNode_set_acc(in_RDI,in_RSI->acc);
  JPCommonNode_set_chain_flag(in_RDI,in_RSI->chain_flag);
  return;
}

Assistant:

void JPCommonNode_copy(JPCommonNode * node1, JPCommonNode * node2)
{
   JPCommonNode_set_pron(node1, node2->pron);
   JPCommonNode_set_pos(node1, node2->pos);
   JPCommonNode_set_ctype(node1, node2->ctype);
   JPCommonNode_set_cform(node1, node2->cform);
   JPCommonNode_set_acc(node1, node2->acc);
   JPCommonNode_set_chain_flag(node1, node2->chain_flag);
}